

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4>
               (__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                begin,__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                      end,anon_class_8_1_d757357c comp)

{
  int iVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  void *pvVar5;
  bool bVar6;
  long lVar7;
  _Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
  *p_Var8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  _Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
  *p_Var12;
  _Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
  *p_Var13;
  long lVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  int iVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  if (begin._M_current == end._M_current) {
    bVar15 = true;
  }
  else {
    p_Var12 = &begin._M_current[1].
               super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
               .
               super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
               .
               super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
    ;
    lVar14 = 0;
    uVar11 = 0;
    do {
      bVar15 = begin._M_current + 1 == end._M_current;
      if (bVar15) {
        return bVar15;
      }
      ppVar2 = *(pointer *)
                ((long)&begin._M_current[1].
                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        .
                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        .
                        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                        ._M_head_impl.
                        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      ppVar3 = begin._M_current[1].
               super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
               .
               super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
               .
               super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
               ._M_head_impl.
               super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar1 = begin._M_current[1].
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
              super__Head_base<3UL,_int,_false>._M_head_impl;
      iVar19 = (int)((ulong)((long)ppVar2 - (long)ppVar3) >> 4);
      iVar9 = (int)((ulong)((long)*(pointer *)
                                   ((long)&((begin._M_current)->
                                           super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                           ).
                                           super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                           .
                                           super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                           ._M_head_impl.
                                           super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                           ._M_impl.super__Vector_impl_data + 8) -
                           (long)((begin._M_current)->
                                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                 ).
                                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                 .
                                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                 ._M_head_impl.
                                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
      auVar21._8_8_ =
           ((begin._M_current)->
           super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           ).
           super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
      auVar21._0_8_ =
           begin._M_current[1].
           super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           .
           super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
           .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
      auVar23._8_8_ = *(comp.computeOverallScore)->bestscoretotal;
      auVar23._0_8_ = *(comp.computeOverallScore)->bestscoretotal;
      auVar21 = divpd(auVar21,auVar23);
      auVar24._0_8_ = (double)iVar19;
      auVar24._8_8_ = (double)iVar9;
      auVar16._0_8_ = (double)(iVar19 - iVar1) * 0.5;
      auVar16._8_8_ =
           (double)(iVar9 - ((begin._M_current)->
                            super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            ).
                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                            super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5;
      auVar16 = divpd(auVar16,auVar24);
      dVar20 = auVar21._0_8_ * 0.5 + auVar16._0_8_;
      dVar22 = auVar21._8_8_ * 0.5 + auVar16._8_8_;
      iVar19 = begin._M_current[1].
               super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
               .super__Head_base<0UL,_int,_false>._M_head_impl;
      bVar6 = iVar19 < ((begin._M_current)->
                       super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       ).super__Head_base<0UL,_int,_false>._M_head_impl;
      if (dVar20 != dVar22) {
        bVar6 = dVar22 < dVar20;
      }
      if (NAN(dVar20) || NAN(dVar22)) {
        bVar6 = dVar22 < dVar20;
      }
      if (bVar6) {
        dVar20 = begin._M_current[1].
                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>.
                 _M_head_impl;
        ppVar4 = *(pointer *)
                  ((long)&begin._M_current[1].
                          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                          .
                          super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                          .
                          super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                          ._M_impl.super__Vector_impl_data + 0x10);
        begin._M_current[1].
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(pointer *)
         ((long)&begin._M_current[1].
                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .
                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                 ._M_head_impl.
                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                 ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
        *(pointer *)
         ((long)&begin._M_current[1].
                 super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .
                 super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                 .
                 super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                 ._M_head_impl.
                 super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                 ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
        lVar7 = 0x30;
        p_Var8 = p_Var12;
        do {
          p_Var13 = p_Var8;
          lVar10 = lVar7;
          *(undefined4 *)(p_Var13 + 1) = *(undefined4 *)(p_Var13 + -1);
          std::
          vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
          ::_M_move_assign(&p_Var13->_M_head_impl,p_Var13 + -2);
          *(undefined8 *)((long)(p_Var13 + -1) + 0x10) =
               *(undefined8 *)((long)(p_Var13 + -3) + 0x10);
          *(undefined4 *)((long)(p_Var13 + -1) + 8) = *(undefined4 *)((long)(p_Var13 + -3) + 8);
          if (lVar14 + lVar10 == 0x30) break;
          iVar9 = (int)((ulong)(*(long *)((long)(p_Var13 + -4) + 8) - *(long *)(p_Var13 + -4)) >> 4)
          ;
          auVar17._8_8_ = *(undefined8 *)((long)(p_Var13 + -5) + 0x10);
          auVar17._0_8_ = dVar20;
          auVar25._8_8_ = *(comp.computeOverallScore)->bestscoretotal;
          auVar25._0_8_ = *(comp.computeOverallScore)->bestscoretotal;
          auVar21 = divpd(auVar17,auVar25);
          dVar22 = auVar21._0_8_ * 0.5 + auVar16._0_8_;
          dVar18 = auVar21._8_8_ * 0.5 +
                   ((double)(iVar9 - *(int *)((long)(p_Var13 + -5) + 8)) * 0.5) / (double)iVar9;
          bVar6 = iVar19 < *(int *)(p_Var13 + -3);
          if (dVar22 != dVar18) {
            bVar6 = dVar18 < dVar22;
          }
          if (NAN(dVar22) || NAN(dVar18)) {
            bVar6 = dVar18 < dVar22;
          }
          lVar7 = lVar10 + 0x30;
          p_Var8 = p_Var13 + -2;
        } while (bVar6);
        *(int *)(p_Var13 + -1) = iVar19;
        pvVar5 = *(void **)(p_Var13 + -2);
        *(pointer *)(p_Var13 + -2) = ppVar3;
        *(pointer *)((long)(p_Var13 + -2) + 8) = ppVar2;
        *(pointer *)((long)(p_Var13 + -2) + 0x10) = ppVar4;
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5);
        }
        *(double *)((long)(p_Var13 + -3) + 0x10) = dVar20;
        *(int *)((long)(p_Var13 + -3) + 8) = iVar1;
        uVar11 = uVar11 + (lVar10 >> 4) * -0x5555555555555555;
      }
      p_Var12 = p_Var12 + 2;
      lVar14 = lVar14 + -0x30;
      begin._M_current = begin._M_current + 1;
    } while (uVar11 < 9);
  }
  return bVar15;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }